

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-a64.c
# Opt level: O1

void handle_shri_with_rndacc
               (TCGContext_conflict1 *tcg_ctx,TCGv_i64 tcg_res,TCGv_i64 tcg_src,TCGv_i64 tcg_rnd,
               _Bool accumulate,_Bool is_u,int size,int shift)

{
  TCGTemp *pTVar1;
  TCGv_i64 bh;
  TCGv_i64 pTVar2;
  int64_t arg2;
  int iVar3;
  TCGOpcode opc;
  uintptr_t o_2;
  uintptr_t o;
  uintptr_t o_1;
  bool bVar4;
  bool bVar5;
  TCGv_i64 local_58;
  
  bVar4 = tcg_rnd != (TCGv_i64)0x0;
  bVar5 = size == 3;
  if (bVar5 && bVar4) {
    iVar3 = 0x40 - shift;
    pTVar1 = tcg_temp_new_internal_aarch64(tcg_ctx,TCG_TYPE_I64,false);
    local_58 = (TCGv_i64)((long)pTVar1 - (long)tcg_ctx);
  }
  else {
    if ((is_u && !accumulate) && shift == 0x40) {
      tcg_gen_op2_aarch64(tcg_ctx,INDEX_op_movi_i64,(TCGArg)(tcg_res + (long)tcg_ctx),0);
      return;
    }
    iVar3 = 0;
  }
  if (tcg_rnd == (TCGv_i64)0x0) {
LAB_006ba3ed:
    if (!is_u) {
      if (shift == 0x40) {
        arg2 = 0x3f;
      }
      else {
        arg2 = (int64_t)shift;
      }
      tcg_gen_sari_i64_aarch64(tcg_ctx,tcg_src,tcg_src,arg2);
      goto LAB_006ba4a4;
    }
    if (shift != 0x40) {
      tcg_gen_shri_i64_aarch64(tcg_ctx,tcg_src,tcg_src,(long)shift);
      goto LAB_006ba4a4;
    }
    opc = INDEX_op_movi_i64;
    pTVar2 = (TCGv_i64)0x0;
  }
  else {
    if (bVar5 && bVar4) {
      bh = tcg_const_i64_aarch64(tcg_ctx,0);
      pTVar2 = bh;
      if (!is_u) {
        tcg_gen_sari_i64_aarch64(tcg_ctx,local_58,tcg_src,0x3f);
        pTVar2 = local_58;
      }
      tcg_gen_add2_i64_aarch64(tcg_ctx,tcg_src,local_58,tcg_src,pTVar2,tcg_rnd,bh);
      tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(bh + (long)tcg_ctx));
    }
    else {
      tcg_gen_op3_aarch64(tcg_ctx,INDEX_op_add_i64,(TCGArg)(tcg_src + (long)&tcg_ctx->pool_cur),
                          (TCGArg)(tcg_src + (long)&tcg_ctx->pool_cur),
                          (TCGArg)(tcg_rnd + (long)tcg_ctx));
    }
    if (!bVar5 || !bVar4) goto LAB_006ba3ed;
    if (iVar3 != 0) {
      tcg_gen_shri_i64_aarch64(tcg_ctx,tcg_src,tcg_src,(long)shift);
      tcg_gen_shli_i64_aarch64(tcg_ctx,local_58,local_58,(long)iVar3);
      tcg_gen_op3_aarch64(tcg_ctx,INDEX_op_or_i64,(TCGArg)(tcg_src + (long)&tcg_ctx->pool_cur),
                          (TCGArg)(tcg_src + (long)&tcg_ctx->pool_cur),
                          (TCGArg)(local_58 + (long)&tcg_ctx->pool_cur));
      goto LAB_006ba4a4;
    }
    if (local_58 == tcg_src) goto LAB_006ba4a4;
    pTVar2 = local_58 + (long)&tcg_ctx->pool_cur;
    opc = INDEX_op_mov_i64;
  }
  tcg_gen_op2_aarch64(tcg_ctx,opc,(TCGArg)(tcg_src + (long)&tcg_ctx->pool_cur),(TCGArg)pTVar2);
LAB_006ba4a4:
  if (accumulate) {
    tcg_gen_op3_aarch64(tcg_ctx,INDEX_op_add_i64,(TCGArg)(tcg_res + (long)tcg_ctx),
                        (TCGArg)(tcg_res + (long)tcg_ctx),(TCGArg)(tcg_src + (long)tcg_ctx));
  }
  else if (tcg_res != tcg_src) {
    tcg_gen_op2_aarch64(tcg_ctx,INDEX_op_mov_i64,(TCGArg)(tcg_res + (long)tcg_ctx),
                        (TCGArg)(tcg_src + (long)tcg_ctx));
  }
  if (!bVar5 || !bVar4) {
    return;
  }
  tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(local_58 + (long)tcg_ctx));
  return;
}

Assistant:

static void handle_shri_with_rndacc(TCGContext *tcg_ctx, TCGv_i64 tcg_res, TCGv_i64 tcg_src,
                                    TCGv_i64 tcg_rnd, bool accumulate,
                                    bool is_u, int size, int shift)
{
    bool extended_result = false;
    bool round = tcg_rnd != NULL;
    int ext_lshift = 0;
    TCGv_i64 tcg_src_hi;

    if (round && size == 3) {
        extended_result = true;
        ext_lshift = 64 - shift;
        tcg_src_hi = tcg_temp_new_i64(tcg_ctx);
    } else if (shift == 64) {
        if (!accumulate && is_u) {
            /* result is zero */
            tcg_gen_movi_i64(tcg_ctx, tcg_res, 0);
            return;
        }
    }

    /* Deal with the rounding step */
    if (round) {
        if (extended_result) {
            TCGv_i64 tcg_zero = tcg_const_i64(tcg_ctx, 0);
            if (!is_u) {
                /* take care of sign extending tcg_res */
                tcg_gen_sari_i64(tcg_ctx, tcg_src_hi, tcg_src, 63);
                tcg_gen_add2_i64(tcg_ctx, tcg_src, tcg_src_hi,
                                 tcg_src, tcg_src_hi,
                                 tcg_rnd, tcg_zero);
            } else {
                tcg_gen_add2_i64(tcg_ctx, tcg_src, tcg_src_hi,
                                 tcg_src, tcg_zero,
                                 tcg_rnd, tcg_zero);
            }
            tcg_temp_free_i64(tcg_ctx, tcg_zero);
        } else {
            tcg_gen_add_i64(tcg_ctx, tcg_src, tcg_src, tcg_rnd);
        }
    }

    /* Now do the shift right */
    if (round && extended_result) {
        /* extended case, >64 bit precision required */
        if (ext_lshift == 0) {
            /* special case, only high bits matter */
            tcg_gen_mov_i64(tcg_ctx, tcg_src, tcg_src_hi);
        } else {
            tcg_gen_shri_i64(tcg_ctx, tcg_src, tcg_src, shift);
            tcg_gen_shli_i64(tcg_ctx, tcg_src_hi, tcg_src_hi, ext_lshift);
            tcg_gen_or_i64(tcg_ctx, tcg_src, tcg_src, tcg_src_hi);
        }
    } else {
        if (is_u) {
            if (shift == 64) {
                /* essentially shifting in 64 zeros */
                tcg_gen_movi_i64(tcg_ctx, tcg_src, 0);
            } else {
                tcg_gen_shri_i64(tcg_ctx, tcg_src, tcg_src, shift);
            }
        } else {
            if (shift == 64) {
                /* effectively extending the sign-bit */
                tcg_gen_sari_i64(tcg_ctx, tcg_src, tcg_src, 63);
            } else {
                tcg_gen_sari_i64(tcg_ctx, tcg_src, tcg_src, shift);
            }
        }
    }

    if (accumulate) {
        tcg_gen_add_i64(tcg_ctx, tcg_res, tcg_res, tcg_src);
    } else {
        tcg_gen_mov_i64(tcg_ctx, tcg_res, tcg_src);
    }

    if (extended_result) {
        tcg_temp_free_i64(tcg_ctx, tcg_src_hi);
    }
}